

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaL_register(lua_State *L,char *libname,luaL_Reg *l)

{
  TValue *pTVar1;
  StkId pTVar2;
  char **ppcVar3;
  luaL_Reg *plVar4;
  char *pcVar5;
  int szhint;
  
  if (libname != (char *)0x0) {
    if (l->name == (char *)0x0) {
      szhint = 0;
    }
    else {
      plVar4 = l + 1;
      szhint = 0;
      do {
        szhint = szhint + 1;
        ppcVar3 = &plVar4->name;
        plVar4 = plVar4 + 1;
      } while (*ppcVar3 != (char *)0x0);
    }
    luaL_findtable(L,-10000,"_LOADED",1);
    lua_getfield(L,-1,libname);
    pTVar1 = L->top + -1;
    if ((pTVar1 == &luaO_nilobject_) || (L->top[-1].tt != 5)) {
      L->top = pTVar1;
      pcVar5 = luaL_findtable(L,-0x2712,libname,szhint);
      if (pcVar5 != (char *)0x0) {
        luaL_error(L,"name conflict for module \'%s\'",libname);
      }
      pTVar2 = L->top;
      pTVar2->value = pTVar2[-1].value;
      pTVar2->tt = pTVar2[-1].tt;
      L->top = L->top + 1;
      lua_setfield(L,-3,libname);
    }
    lua_remove(L,-2);
    lua_insert(L,-1);
  }
  if (l->name != (char *)0x0) {
    plVar4 = l + 1;
    do {
      lua_pushcclosure(L,plVar4[-1].func,0);
      lua_setfield(L,-2,plVar4[-1].name);
      ppcVar3 = &plVar4->name;
      plVar4 = plVar4 + 1;
    } while (*ppcVar3 != (char *)0x0);
  }
  return;
}

Assistant:

static void luaL_register(lua_State*L,const char*libname,
const luaL_Reg*l){
luaI_openlib(L,libname,l,0);
}